

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O1

void __thiscall rst::Parser::EnterBlock(Parser *this,BlockType *prev_type,BlockType type)

{
  if (*prev_type != type) {
    if (*prev_type == LIST_ITEM) {
      (*this->handler_->_vptr_ContentHandler[3])();
    }
    if (type == LIST_ITEM) {
      (*this->handler_->_vptr_ContentHandler[2])(this->handler_,3);
    }
    *prev_type = type;
  }
  return;
}

Assistant:

void rst::Parser::EnterBlock(rst::BlockType &prev_type, rst::BlockType type) {
  if (type == prev_type)
    return;
  if (prev_type == LIST_ITEM)
    handler_->EndBlock();
  if (type == LIST_ITEM)
    handler_->StartBlock(BULLET_LIST);
  prev_type = type;
}